

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool __thiscall crunch::process_files(crunch *this,file_desc_vec *files)

{
  undefined1 uVar1;
  bool bVar2;
  char c;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  ssize_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  size_t __nbytes;
  vector<crnlib::find_files::file_desc> *in_RSI;
  long in_RDI;
  convert_status status;
  dynamic_string out_path;
  dynamic_string out_drive_1;
  dynamic_string out_dir_1;
  dynamic_string out_ext;
  dynamic_string out_name;
  dynamic_string out_dir;
  dynamic_string out_drive;
  dynamic_string out_filename;
  crn_header in_header;
  cfile_stream in_stream;
  format input_file_type;
  dynamic_string fmt;
  format out_file_type;
  char *in_stack_000002a0;
  dynamic_string in_ext;
  dynamic_string in_fname;
  dynamic_string in_path;
  dynamic_string in_drive;
  dynamic_string *in_filename;
  file_desc *file_desc;
  uint32 file_index;
  bool info_mode;
  bool compare_mode;
  dynamic_string *in_stack_00000518;
  dynamic_string *in_stack_00000520;
  dynamic_string *in_stack_00000528;
  dynamic_string *in_stack_00000530;
  char *in_stack_00000538;
  dynamic_string *in_stack_00000d58;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  convert_status in_stack_fffffffffffffce4;
  convert_status cVar10;
  crunch *in_stack_fffffffffffffce8;
  convert_status in_stack_fffffffffffffcf0;
  uint in_stack_fffffffffffffcf4;
  uint in_stack_fffffffffffffcf8;
  uint in_stack_fffffffffffffcfc;
  dynamic_string *in_stack_fffffffffffffd00;
  convert_status in_stack_fffffffffffffd08;
  uint in_stack_fffffffffffffd0c;
  uint in_stack_fffffffffffffd10;
  convert_status in_stack_fffffffffffffd14;
  uint in_stack_fffffffffffffd18;
  uint in_stack_fffffffffffffd1c;
  dynamic_string *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd68;
  format in_stack_fffffffffffffe0c;
  uint in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  format in_stack_fffffffffffffe1c;
  uint32 in_stack_fffffffffffffe20;
  uint32 in_stack_fffffffffffffe24;
  undefined1 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe29;
  undefined1 in_stack_fffffffffffffe2a;
  uint uVar11;
  convert_status local_1c4;
  dynamic_string local_1b0;
  dynamic_string local_1a0;
  dynamic_string local_190;
  dynamic_string local_180;
  dynamic_string local_170;
  dynamic_string local_160;
  dynamic_string local_150;
  dynamic_string local_140;
  undefined1 local_12a [18];
  crn_packed_uint local_118 [8];
  char *in_stack_fffffffffffffef0;
  uint32 in_stack_fffffffffffffef8;
  uint32 in_stack_fffffffffffffefc;
  crunch *in_stack_ffffffffffffff00;
  cfile_stream local_e0;
  format local_a0;
  int local_9c;
  dynamic_string local_98;
  format local_84;
  dynamic_string local_80;
  dynamic_string local_70 [2];
  dynamic_string local_50;
  dynamic_string local_40;
  file_desc *local_30;
  file_desc *local_28;
  uint local_20;
  byte local_1a;
  byte local_19;
  vector<crnlib::find_files::file_desc> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  local_19 = crnlib::command_line_params::get_value_as_bool
                       ((command_line_params *)
                        CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                        (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                        (uint)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                        SUB81((ulong)in_stack_fffffffffffffce8 >> 0x18,0));
  local_1a = crnlib::command_line_params::get_value_as_bool
                       ((command_line_params *)
                        CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                        (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                        (uint)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                        SUB81((ulong)in_stack_fffffffffffffce8 >> 0x18,0));
  local_20 = 0;
  local_1c4 = in_stack_fffffffffffffce4;
  while (uVar11 = local_20, uVar3 = crnlib::vector<crnlib::find_files::file_desc>::size(local_18),
        uVar11 < uVar3) {
    local_30 = crnlib::vector<crnlib::find_files::file_desc>::operator[](local_18,local_20);
    local_28 = local_30;
    crnlib::dynamic_string::dynamic_string(&local_40);
    crnlib::dynamic_string::dynamic_string(&local_50);
    crnlib::dynamic_string::dynamic_string(local_70);
    crnlib::dynamic_string::dynamic_string(&local_80);
    crnlib::dynamic_string::get_ptr(&local_30->m_fullname);
    crnlib::file_utils::split_path
              (in_stack_00000538,in_stack_00000530,in_stack_00000528,in_stack_00000520,
               in_stack_00000518);
    local_84 = cFormatCRN;
    crnlib::dynamic_string::dynamic_string(&local_98);
    uVar1 = crnlib::command_line_params::get_value_as_string
                      ((command_line_params *)
                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                       (char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                       in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc
                      );
    if ((bool)uVar1) {
      in_stack_fffffffffffffe2a =
           crnlib::dynamic_string::operator==
                     ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0),
                      (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      if ((bool)in_stack_fffffffffffffe2a) {
        local_84 = cFormatTGA;
        goto LAB_00111720;
      }
      in_stack_fffffffffffffe29 =
           crnlib::dynamic_string::operator==
                     ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0),
                      (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      if ((bool)in_stack_fffffffffffffe29) {
        local_84 = cFormatBMP;
        goto LAB_00111720;
      }
      in_stack_fffffffffffffe28 =
           crnlib::dynamic_string::operator==
                     ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0),
                      (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      if ((bool)in_stack_fffffffffffffe28) {
        local_84 = cFormatDDS;
        goto LAB_00111720;
      }
      bVar2 = crnlib::dynamic_string::operator==
                        ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0),
                         (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      in_stack_fffffffffffffe24 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe24);
      if (bVar2) {
        local_84 = cFormatKTX;
        goto LAB_00111720;
      }
      bVar2 = crnlib::dynamic_string::operator==
                        ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0),
                         (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      in_stack_fffffffffffffe24 =
           CONCAT13((char)(in_stack_fffffffffffffe24 >> 0x18),
                    CONCAT12(bVar2,(short)in_stack_fffffffffffffe24));
      if (bVar2) {
        local_84 = cFormatCRN;
        goto LAB_00111720;
      }
      bVar2 = crnlib::dynamic_string::operator==
                        ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0),
                         (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      in_stack_fffffffffffffe24 =
           (uint)CONCAT21((short)(in_stack_fffffffffffffe24 >> 0x10),bVar2) << 8;
      if (bVar2) {
        local_84 = cFormatPNG;
        goto LAB_00111720;
      }
      pcVar5 = crnlib::dynamic_string::get_ptr(&local_98);
      crnlib::console::error("Unsupported output file type: %s",pcVar5);
      local_1 = 0;
      local_9c = 1;
    }
    else {
LAB_00111720:
      bVar2 = crnlib::command_line_params::has_key
                        ((command_line_params *)
                         CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                         (char *)in_stack_fffffffffffffce8);
      in_stack_fffffffffffffe24 = CONCAT31((int3)(in_stack_fffffffffffffe24 >> 8),bVar2);
      if (!bVar2) {
        bVar2 = crnlib::command_line_params::has_key
                          ((command_line_params *)
                           CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                           (char *)in_stack_fffffffffffffce8);
        in_stack_fffffffffffffe20 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe20);
        if (bVar2) {
          local_84 = cFormatPNG;
        }
        else {
          crnlib::dynamic_string::get_ptr(&local_30->m_fullname);
          in_stack_fffffffffffffe1c =
               crnlib::texture_file_types::determine_file_format
                         ((char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          local_a0 = in_stack_fffffffffffffe1c;
          if (in_stack_fffffffffffffe1c == cFormatCRN) {
            local_84 = cFormatDDS;
            crnlib::cfile_stream::cfile_stream
                      ((cfile_stream *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
            crnd::crn_header::crn_header
                      ((crn_header *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
            pcVar5 = crnlib::dynamic_string::get_ptr(&local_30->m_fullname);
            __nbytes = 0;
            uVar4 = crnlib::cfile_stream::open(&local_e0,pcVar5,5);
            in_stack_fffffffffffffe18 = CONCAT13((char)uVar4,(int3)in_stack_fffffffffffffe18);
            if ((uVar4 & 1) != 0) {
              sVar6 = crnlib::cfile_stream::read(&local_e0,(int)local_12a,(void *)0x4a,__nbytes);
              in_stack_fffffffffffffe14 = (int)sVar6;
              if ((in_stack_fffffffffffffe14 == 0x4a) &&
                 ((((in_stack_fffffffffffffe10 =
                          crnd::crn_packed_uint::operator_cast_to_unsigned_int(local_118),
                    in_stack_fffffffffffffe10 == 10 ||
                    (in_stack_fffffffffffffe0c =
                          crnd::crn_packed_uint::operator_cast_to_unsigned_int(local_118),
                    in_stack_fffffffffffffe0c == cFormatPPM)) ||
                   (uVar4 = crnd::crn_packed_uint::operator_cast_to_unsigned_int(local_118),
                   uVar4 == 0xc)) ||
                  ((uVar4 = crnd::crn_packed_uint::operator_cast_to_unsigned_int(local_118),
                   uVar4 == 0xd ||
                   (uVar4 = crnd::crn_packed_uint::operator_cast_to_unsigned_int(local_118),
                   uVar4 == 0xe)))))) {
                local_84 = cFormatKTX;
              }
            }
            crnlib::cfile_stream::~cfile_stream
                      ((cfile_stream *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
          }
          else if (in_stack_fffffffffffffe1c == cFormatKTX) {
            local_84 = cFormatPNG;
          }
        }
      }
      crnlib::dynamic_string::dynamic_string(&local_140);
      bVar2 = crnlib::command_line_params::get_value_as_bool
                        ((command_line_params *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                         (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                         (uint)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffffce8 >> 0x18,0));
      if (bVar2) {
        pcVar5 = crnlib::dynamic_string::get_ptr(&local_40);
        pcVar8 = crnlib::dynamic_string::get_ptr(&local_50);
        pcVar9 = crnlib::dynamic_string::get_ptr(local_70);
        pcVar7 = crnlib::texture_file_types::get_extension(local_84);
        crnlib::dynamic_string::format(&local_140,"%s%s%s.%s",pcVar5,pcVar8,pcVar9,pcVar7);
      }
      else {
        bVar2 = crnlib::command_line_params::has_key
                          ((command_line_params *)
                           CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                           (char *)in_stack_fffffffffffffce8);
        if (bVar2) {
          crnlib::command_line_params::get_value_as_string_or_empty
                    ((command_line_params *)
                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                     (char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                     in_stack_fffffffffffffcf8);
          crnlib::dynamic_string::operator=
                    ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0),
                     (dynamic_string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                    );
          uVar3 = crnlib::vector<crnlib::find_files::file_desc>::size(local_18);
          if (1 < uVar3) {
            crnlib::dynamic_string::dynamic_string(&local_150);
            crnlib::dynamic_string::dynamic_string(&local_160);
            crnlib::dynamic_string::dynamic_string(&local_170);
            crnlib::dynamic_string::dynamic_string(&local_180);
            crnlib::dynamic_string::get_ptr(&local_140);
            crnlib::file_utils::split_path
                      (in_stack_00000538,in_stack_00000530,in_stack_00000528,in_stack_00000520,
                       in_stack_00000518);
            pcVar5 = crnlib::dynamic_string::get_ptr(&local_170);
            crnlib::dynamic_string::format(&local_170,"%s_%u",pcVar5,(ulong)local_20);
            pcVar5 = crnlib::dynamic_string::get_ptr(&local_150);
            pcVar8 = crnlib::dynamic_string::get_ptr(&local_160);
            pcVar9 = crnlib::dynamic_string::get_ptr(&local_170);
            pcVar7 = crnlib::dynamic_string::get_ptr(&local_180);
            crnlib::dynamic_string::format(&local_140,"%s%s%s%s",pcVar5,pcVar8,pcVar9,pcVar7);
            crnlib::dynamic_string::~dynamic_string
                      ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
            crnlib::dynamic_string::~dynamic_string
                      ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
            crnlib::dynamic_string::~dynamic_string
                      ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
            crnlib::dynamic_string::~dynamic_string
                      ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
          }
          bVar2 = crnlib::command_line_params::has_key
                            ((command_line_params *)
                             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                             (char *)in_stack_fffffffffffffce8);
          if (!bVar2) {
            crnlib::dynamic_string::get_ptr(&local_140);
            local_84 = crnlib::texture_file_types::determine_file_format
                                 ((char *)CONCAT44(in_stack_fffffffffffffd0c,
                                                   in_stack_fffffffffffffd08));
          }
        }
        else {
          crnlib::command_line_params::get_value_as_string_or_empty
                    ((command_line_params *)
                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                     (char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                     in_stack_fffffffffffffcf8);
          crnlib::dynamic_string::dynamic_string
                    ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0),
                     (dynamic_string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                    );
          bVar2 = crnlib::command_line_params::get_value_as_bool
                            ((command_line_params *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                             (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                             (uint)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffce8 >> 0x18,0));
          if ((bVar2) && (uVar3 = crnlib::dynamic_string::get_len(&local_28->m_rel), uVar3 != 0)) {
            crnlib::dynamic_string::get_ptr(&local_190);
            crnlib::dynamic_string::get_ptr(&local_28->m_rel);
            crnlib::file_utils::combine_path
                      ((dynamic_string *)
                       CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                       (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                       (char *)in_stack_fffffffffffffd00);
          }
          uVar3 = crnlib::dynamic_string::get_len(&local_190);
          if (uVar3 == 0) {
            pcVar5 = crnlib::dynamic_string::get_ptr(local_70);
            pcVar8 = crnlib::texture_file_types::get_extension(local_84);
            crnlib::dynamic_string::format(&local_140,"%s.%s",pcVar5,pcVar8);
          }
          else {
            c = crnlib::dynamic_string::back(&local_190);
            bVar2 = crnlib::file_utils::is_path_separator(c);
            if (bVar2) {
              pcVar5 = crnlib::dynamic_string::get_ptr(&local_190);
              pcVar8 = crnlib::dynamic_string::get_ptr(local_70);
              in_stack_fffffffffffffd68 = crnlib::texture_file_types::get_extension(local_84);
              crnlib::dynamic_string::format
                        (&local_140,"%s%s.%s",pcVar5,pcVar8,in_stack_fffffffffffffd68);
            }
            else {
              pcVar5 = crnlib::dynamic_string::get_ptr(&local_190);
              pcVar8 = crnlib::dynamic_string::get_ptr(local_70);
              pcVar9 = crnlib::texture_file_types::get_extension(local_84);
              crnlib::dynamic_string::format(&local_140,"%s\\%s.%s",pcVar5,pcVar8,pcVar9);
            }
          }
          bVar2 = crnlib::command_line_params::get_value_as_bool
                            ((command_line_params *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                             (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                             (uint)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffce8 >> 0x18,0));
          if ((((bVar2) && (bVar2 = crnlib::file_utils::full_path(in_stack_00000d58), bVar2)) &&
              ((local_19 & 1) == 0)) && ((local_1a & 1) == 0)) {
            crnlib::dynamic_string::dynamic_string(&local_1a0);
            crnlib::dynamic_string::dynamic_string(&local_1b0);
            crnlib::dynamic_string::get_ptr(&local_140);
            crnlib::file_utils::split_path
                      (in_stack_00000538,in_stack_00000530,in_stack_00000528,in_stack_00000520,
                       in_stack_00000518);
            crnlib::dynamic_string::operator+=
                      ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0),
                       (dynamic_string *)
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
            crnlib::dynamic_string::get_ptr(&local_1a0);
            crnlib::dynamic_string::dynamic_string
                      ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0),
                       (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
            crnlib::file_utils::create_path(in_stack_fffffffffffffd20);
            crnlib::dynamic_string::~dynamic_string
                      ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
            crnlib::dynamic_string::~dynamic_string
                      ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
            crnlib::dynamic_string::~dynamic_string
                      ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
          }
          crnlib::dynamic_string::~dynamic_string
                    ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
        }
      }
      cVar10 = local_1c4;
      if (((local_19 & 1) == 0) && ((local_1a & 1) == 0)) {
        crnlib::dynamic_string::get_ptr(&local_140);
        bVar2 = crnlib::file_utils::does_file_exist(in_stack_fffffffffffffd68);
        cVar10 = local_1c4;
        if (!bVar2) goto LAB_001122bf;
        bVar2 = crnlib::command_line_params::get_value_as_bool
                          ((command_line_params *)
                           CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                           (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                           (uint)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffffce8 >> 0x18,0));
        if (!bVar2) {
          bVar2 = crnlib::command_line_params::get_value_as_bool
                            ((command_line_params *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                             (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                             (uint)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffce8 >> 0x18,0));
          cVar10 = local_1c4;
          if (bVar2) {
            in_stack_fffffffffffffd20 =
                 (dynamic_string *)crnlib::dynamic_string::get_ptr(&local_30->m_fullname);
            pcVar5 = crnlib::dynamic_string::get_ptr(&local_140);
            bVar2 = crnlib::file_utils::is_older_than((char *)in_stack_fffffffffffffd20,pcVar5);
            cVar10 = local_1c4;
            if (bVar2) {
              pcVar5 = crnlib::dynamic_string::get_ptr(&local_140);
              crnlib::console::warning("Skipping up to date file: %s\n",pcVar5);
              *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x4c) + 1;
              local_9c = 4;
              goto LAB_00112556;
            }
          }
          goto LAB_001122bf;
        }
        pcVar5 = crnlib::dynamic_string::get_ptr(&local_140);
        crnlib::console::warning("Skipping already existing file: %s\n",pcVar5);
        *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x4c) + 1;
        local_9c = 4;
        goto LAB_00112556;
      }
LAB_001122bf:
      local_1c4 = cCSFailed;
      if ((local_1a & 1) == 0) {
        if ((local_19 & 1) == 0) {
          crnlib::dynamic_string::get_ptr(&local_140);
          bVar2 = read_only_file_check
                            (in_stack_fffffffffffffce8,
                             (char *)CONCAT44(cVar10,in_stack_fffffffffffffce0));
          in_stack_fffffffffffffcfc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffcfc);
          if (bVar2) {
            in_stack_fffffffffffffcf4 = local_20;
            in_stack_fffffffffffffcf8 =
                 crnlib::vector<crnlib::find_files::file_desc>::size(local_18);
            in_stack_fffffffffffffce8 =
                 (crunch *)crnlib::dynamic_string::get_ptr(&local_30->m_fullname);
            crnlib::dynamic_string::get_ptr(&local_140);
            in_stack_fffffffffffffcf0 =
                 convert_file((crunch *)in_fname._0_8_,in_ext.m_pStr._4_4_,(uint32)in_ext.m_pStr,
                              (char *)in_ext._0_8_,in_stack_000002a0,fmt.m_pStr._4_4_);
            local_1c4 = in_stack_fffffffffffffcf0;
          }
        }
        else {
          in_stack_fffffffffffffd0c = local_20;
          in_stack_fffffffffffffd10 = crnlib::vector<crnlib::find_files::file_desc>::size(local_18);
          in_stack_fffffffffffffd00 =
               (dynamic_string *)crnlib::dynamic_string::get_ptr(&local_30->m_fullname);
          crnlib::dynamic_string::get_ptr(&local_140);
          in_stack_fffffffffffffd08 =
               compare_file((crunch *)
                            CONCAT44(uVar11,CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffe2a,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe29,
                                                  in_stack_fffffffffffffe28)))),
                            in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
                            (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                            (char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            in_stack_fffffffffffffe0c);
          local_1c4 = in_stack_fffffffffffffd08;
        }
      }
      else {
        in_stack_fffffffffffffd18 = local_20;
        in_stack_fffffffffffffd1c = crnlib::vector<crnlib::find_files::file_desc>::size(local_18);
        crnlib::dynamic_string::get_ptr(&local_30->m_fullname);
        in_stack_fffffffffffffd14 =
             display_file_info(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                               in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        local_1c4 = in_stack_fffffffffffffd14;
      }
      *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + 1;
      if (local_1c4 == cCSSucceeded) {
        crnlib::console::info("");
        *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + 1;
LAB_0011254b:
        local_9c = 0;
      }
      else {
        if (local_1c4 == cCSSkipped) {
          crnlib::console::info("Skipping file.\n");
          *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x4c) + 1;
          goto LAB_0011254b;
        }
        if (local_1c4 == cCSBadParam) {
          local_1 = 0;
          local_9c = 1;
        }
        else {
          bVar2 = crnlib::command_line_params::get_value_as_bool
                            ((command_line_params *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                             (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                             (uint)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffce8 >> 0x18,0));
          in_stack_fffffffffffffce0 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffce0);
          if (bVar2) {
            crnlib::console::info("");
            *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) + 1;
            goto LAB_0011254b;
          }
          local_1 = 0;
          local_9c = 1;
        }
      }
LAB_00112556:
      crnlib::dynamic_string::~dynamic_string
                ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
    }
    crnlib::dynamic_string::~dynamic_string
              ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
    crnlib::dynamic_string::~dynamic_string
              ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
    crnlib::dynamic_string::~dynamic_string
              ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
    crnlib::dynamic_string::~dynamic_string
              ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
    crnlib::dynamic_string::~dynamic_string
              ((dynamic_string *)CONCAT44(local_1c4,in_stack_fffffffffffffce0));
    if ((local_9c != 0) && (local_9c == 1)) goto LAB_00112632;
    local_20 = local_20 + 1;
    in_stack_fffffffffffffcdc = local_9c;
  }
  local_1 = 1;
LAB_00112632:
  return (bool)(local_1 & 1);
}

Assistant:

bool process_files(find_files::file_desc_vec& files) {
    const bool compare_mode = m_params.get_value_as_bool("compare");
    const bool info_mode = m_params.get_value_as_bool("info");

    for (uint32 file_index = 0; file_index < files.size(); file_index++) {
      const find_files::file_desc& file_desc = files[file_index];
      const dynamic_string& in_filename = file_desc.m_fullname;

      dynamic_string in_drive, in_path, in_fname, in_ext;
      file_utils::split_path(in_filename.get_ptr(), &in_drive, &in_path, &in_fname, &in_ext);

      texture_file_types::format out_file_type = texture_file_types::cFormatCRN;
      dynamic_string fmt;
      if (m_params.get_value_as_string("fileformat", 0, fmt)) {
        if (fmt == "tga")
          out_file_type = texture_file_types::cFormatTGA;
        else if (fmt == "bmp")
          out_file_type = texture_file_types::cFormatBMP;
        else if (fmt == "dds")
          out_file_type = texture_file_types::cFormatDDS;
        else if (fmt == "ktx")
          out_file_type = texture_file_types::cFormatKTX;
        else if (fmt == "crn")
          out_file_type = texture_file_types::cFormatCRN;
        else if (fmt == "png")
          out_file_type = texture_file_types::cFormatPNG;
        else {
          console::error("Unsupported output file type: %s", fmt.get_ptr());
          return false;
        }
      }

      // No explicit output format has been specified - try to determine something doable.
      if (!m_params.has_key("fileformat")) {
        if (m_params.has_key("split")) {
          out_file_type = texture_file_types::cFormatPNG;
        } else {
          texture_file_types::format input_file_type = texture_file_types::determine_file_format(in_filename.get_ptr());
          if (input_file_type == texture_file_types::cFormatCRN) {
            out_file_type = texture_file_types::cFormatDDS;
            cfile_stream in_stream;
            crnd::crn_header in_header;
            if (in_stream.open(in_filename.get_ptr()) && in_stream.read(&in_header, sizeof(in_header)) == sizeof(in_header) &&
                (in_header.m_format == cCRNFmtETC1 || in_header.m_format == cCRNFmtETC2 || in_header.m_format == cCRNFmtETC2A || in_header.m_format == cCRNFmtETC1S || in_header.m_format == cCRNFmtETC2AS))
              out_file_type = texture_file_types::cFormatKTX;
          } else if (input_file_type == texture_file_types::cFormatKTX) {
            // Default to converting KTX files to PNG
            out_file_type = texture_file_types::cFormatPNG;
          }
        }
      }

      dynamic_string out_filename;
      if (m_params.get_value_as_bool("outsamedir"))
        out_filename.format("%s%s%s.%s", in_drive.get_ptr(), in_path.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
      else if (m_params.has_key("out")) {
        out_filename = m_params.get_value_as_string_or_empty("out");

        if (files.size() > 1) {
          dynamic_string out_drive, out_dir, out_name, out_ext;
          file_utils::split_path(out_filename.get_ptr(), &out_drive, &out_dir, &out_name, &out_ext);

          out_name.format("%s_%u", out_name.get_ptr(), file_index);

          out_filename.format("%s%s%s%s", out_drive.get_ptr(), out_dir.get_ptr(), out_name.get_ptr(), out_ext.get_ptr());
        }

        if (!m_params.has_key("fileformat"))
          out_file_type = texture_file_types::determine_file_format(out_filename.get_ptr());
      } else {
        dynamic_string out_dir(m_params.get_value_as_string_or_empty("outdir"));

        if (m_params.get_value_as_bool("recreate") && file_desc.m_rel.get_len()) {
          file_utils::combine_path(out_dir, out_dir.get_ptr(), file_desc.m_rel.get_ptr());
        }

        if (out_dir.get_len()) {
          if (file_utils::is_path_separator(out_dir.back()))
            out_filename.format("%s%s.%s", out_dir.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
          else
            out_filename.format("%s\\%s.%s", out_dir.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
        } else {
          out_filename.format("%s.%s", in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
        }

        if (m_params.get_value_as_bool("recreate")) {
          if (file_utils::full_path(out_filename)) {
            if ((!compare_mode) && (!info_mode)) {
              dynamic_string out_drive, out_path;
              file_utils::split_path(out_filename.get_ptr(), &out_drive, &out_path, NULL, NULL);
              out_drive += out_path;
              file_utils::create_path(out_drive.get_ptr());
            }
          }
        }
      }

      if ((!compare_mode) && (!info_mode)) {
        if (file_utils::does_file_exist(out_filename.get_ptr())) {
          if (m_params.get_value_as_bool("nooverwrite")) {
            console::warning("Skipping already existing file: %s\n", out_filename.get_ptr());
            m_num_skipped++;
            continue;
          }

          if (m_params.get_value_as_bool("timestamp")) {
            if (file_utils::is_older_than(in_filename.get_ptr(), out_filename.get_ptr())) {
              console::warning("Skipping up to date file: %s\n", out_filename.get_ptr());
              m_num_skipped++;
              continue;
            }
          }
        }
      }

      convert_status status = cCSFailed;

      if (info_mode)
        status = display_file_info(file_index, files.size(), in_filename.get_ptr());
      else if (compare_mode)
        status = compare_file(file_index, files.size(), in_filename.get_ptr(), out_filename.get_ptr(), out_file_type);
      else if (read_only_file_check(out_filename.get_ptr()))
        status = convert_file(file_index, files.size(), in_filename.get_ptr(), out_filename.get_ptr(), out_file_type);

      m_num_processed++;

      switch (status) {
        case cCSSucceeded: {
          console::info("");
          m_num_succeeded++;
          break;
        }
        case cCSSkipped: {
          console::info("Skipping file.\n");
          m_num_skipped++;
          break;
        }
        case cCSBadParam: {
          return false;
        }
        default: {
          if (!m_params.get_value_as_bool("ignoreerrors"))
            return false;

          console::info("");

          m_num_failed++;
          break;
        }
      }
    }

    return true;
  }